

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall File::output_text(File *this,ostream *out)

{
  ostream *out_00;
  bool bVar1;
  reference args_1;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference pFVar4;
  reference args;
  int local_12c;
  reference local_128;
  Instruction *ins_1;
  iterator __end2;
  iterator __begin2;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> *__range2;
  int j;
  Function *fun_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<vm::Function,_std::allocator<vm::Function>_> *__range1_3;
  undefined1 local_d8 [8];
  string name;
  Function *fun;
  iterator __end1_2;
  iterator __begin1_2;
  vector<vm::Function,_std::allocator<vm::Function>_> *__range1_2;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Instruction *ins;
  iterator __end1_1;
  iterator __begin1_1;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> *__range1_1;
  reference local_40;
  Constant *constant;
  iterator __end1;
  iterator __begin1;
  vector<vm::Constant,_std::allocator<vm::Constant>_> *__range1;
  ostream *poStack_18;
  int i;
  ostream *out_local;
  File *this_local;
  
  __range1._4_4_ = 0;
  poStack_18 = out;
  out_local = (ostream *)this;
  println<char[12]>(out,(char (*) [12])".constants:");
  __end1 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::begin(&this->constants);
  constant = (Constant *)
             std::vector<vm::Constant,_std::allocator<vm::Constant>_>::end(&this->constants);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
                                *)&constant);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
               ::operator*(&__end1);
    __range1_1._4_4_ = __range1._4_4_;
    __range1._4_4_ = __range1._4_4_ + 1;
    println<int,vm::Constant>(poStack_18,(int *)((long)&__range1_1 + 4),local_40);
    __gnu_cxx::
    __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>::
    operator++(&__end1);
  }
  __range1._4_4_ = 0;
  println<char[8]>(poStack_18,(char (*) [8])".start:");
  __end1_1 = std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::begin(&this->start);
  ins = (Instruction *)
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::end(&this->start);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
                        *)&ins);
    if (!bVar1) break;
    args_1 = __gnu_cxx::
             __normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
             ::operator*(&__end1_1);
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = __range1._4_4_;
    __range1._4_4_ = __range1._4_4_ + 1;
    println<int,vm::Instruction>
              (poStack_18,
               (int *)((long)&names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),args_1);
    __gnu_cxx::
    __normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  __range1._4_4_ = 0;
  println<char[12]>(poStack_18,(char (*) [12])".functions:");
  __end1_2 = std::vector<vm::Function,_std::allocator<vm::Function>_>::begin(&this->functions);
  fun = (Function *)std::vector<vm::Function,_std::allocator<vm::Function>_>::end(&this->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
                        *)&fun);
    if (!bVar1) break;
    name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
         ::operator*(&__end1_2);
    pvVar2 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                       (&this->constants,(ulong)((reference)name.field_2._8_8_)->nameIndex);
    pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&pvVar2->value);
    std::__cxx11::string::string((string *)local_d8,(string *)pbVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88,(value_type *)local_d8);
    __range1_3._4_4_ = __range1._4_4_;
    __range1._4_4_ = __range1._4_4_ + 1;
    println<int,unsigned_short,unsigned_short,unsigned_short,char[2],std::__cxx11::string>
              (poStack_18,(int *)((long)&__range1_3 + 4),(unsigned_short *)name.field_2._8_8_,
               (unsigned_short *)(name.field_2._8_8_ + 2),(unsigned_short *)(name.field_2._8_8_ + 4)
               ,(char (*) [2])"#",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    __gnu_cxx::
    __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>::
    operator++(&__end1_2);
  }
  __range1._4_4_ = 0;
  __end1_3 = std::vector<vm::Function,_std::allocator<vm::Function>_>::begin(&this->functions);
  fun_1 = (Function *)
          std::vector<vm::Function,_std::allocator<vm::Function>_>::end(&this->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
                        *)&fun_1);
    if (!bVar1) break;
    pFVar4 = __gnu_cxx::
             __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
             ::operator*(&__end1_3);
    out_00 = poStack_18;
    args = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88,(long)__range1._4_4_);
    printfmt<int,std::__cxx11::string>(out_00,".F{}: # {}",(int *)((long)&__range1 + 4),args);
    println(poStack_18);
    __range2._4_4_ = 0;
    __end2 = std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::begin
                       (&pFVar4->instructions);
    ins_1 = (Instruction *)
            std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::end
                      (&pFVar4->instructions);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
                                  *)&ins_1);
      if (!bVar1) break;
      local_128 = __gnu_cxx::
                  __normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
                  ::operator*(&__end2);
      local_12c = __range2._4_4_;
      println<int,vm::Instruction>(poStack_18,&local_12c,local_128);
      __gnu_cxx::
      __normal_iterator<vm::Instruction_*,_std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>_>
      ::operator++(&__end2);
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>::
    operator++(&__end1_3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  return;
}

Assistant:

void File::output_text(std::ostream& out) {
    int i;
    
    i = 0;
    println(out, ".constants:");
    for (auto& constant : constants) {
        println(out, i++, constant);
    }

    i = 0;
    println(out, ".start:");
    for (auto& ins : start) {
        println(out, i++, ins);
    }

    std::vector<std::string> names;
    i = 0;
    println(out, ".functions:");
    for (auto& fun : functions) {
        std::string name = std::get<std::string>(constants.at(fun.nameIndex).value);
        names.push_back(name);
        println(out, i++, fun.nameIndex, fun.paramSize, fun.level, "#", name);
    }
    
    i = 0;
    for (auto& fun : functions) {
        printfmt(out, ".F{}: # {}", i, names.at(i)); println(out);
        int j = 0;
        for (auto& ins : fun.instructions) {
            println(out, j++, ins);
        }
        ++i;
    }
}